

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O1

void aom_paeth_predictor_32x8_ssse3(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  ulong uVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  ushort uVar21;
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  ushort uVar31;
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  unkuint9 Var34;
  undefined1 auVar35 [11];
  undefined1 auVar36 [13];
  undefined1 auVar37 [15];
  unkuint9 Var38;
  undefined1 auVar39 [11];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  int iVar44;
  uint8_t *puVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar52 [16];
  undefined1 auVar60 [16];
  short sVar61;
  short sVar64;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  short sVar65;
  short sVar68;
  short sVar69;
  short sVar70;
  short sVar71;
  short sVar74;
  short sVar77;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  short sVar80;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 in_XMM7 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  short sVar103;
  short sVar106;
  short sVar107;
  short sVar108;
  short sVar109;
  short sVar110;
  short sVar111;
  undefined1 in_XMM15 [16];
  undefined1 auVar104 [16];
  short sVar112;
  undefined1 auVar105 [16];
  short sVar50;
  short sVar51;
  byte bVar53;
  byte bVar54;
  byte bVar55;
  byte bVar56;
  byte bVar57;
  byte bVar58;
  byte bVar59;
  byte bVar72;
  byte bVar73;
  byte bVar75;
  byte bVar76;
  byte bVar78;
  byte bVar79;
  byte bVar81;
  
  auVar62 = *(undefined1 (*) [16])above;
  auVar47 = *(undefined1 (*) [16])(above + 0x10);
  auVar19[0xd] = 0;
  auVar19._0_13_ = auVar62._0_13_;
  auVar19[0xe] = auVar62[7];
  uVar21 = auVar19._13_2_;
  auVar22[0xc] = auVar62[6];
  auVar22._0_12_ = auVar62._0_12_;
  auVar22._13_2_ = uVar21;
  auVar24[0xb] = 0;
  auVar24._0_11_ = auVar62._0_11_;
  auVar24._12_3_ = auVar22._12_3_;
  auVar26[10] = auVar62[5];
  auVar26._0_10_ = auVar62._0_10_;
  auVar26._11_4_ = auVar24._11_4_;
  auVar28[9] = 0;
  auVar28._0_9_ = auVar62._0_9_;
  auVar28._10_5_ = auVar26._10_5_;
  auVar30[8] = auVar62[4];
  auVar30._0_8_ = auVar62._0_8_;
  auVar30._9_6_ = auVar28._9_6_;
  auVar33._7_8_ = 0;
  auVar33._0_7_ = auVar30._8_7_;
  Var34 = CONCAT81(SUB158(auVar33 << 0x40,7),auVar62[3]);
  auVar40._9_6_ = 0;
  auVar40._0_9_ = Var34;
  auVar35._1_10_ = SUB1510(auVar40 << 0x30,5);
  auVar35[0] = auVar62[2];
  auVar41._11_4_ = 0;
  auVar41._0_11_ = auVar35;
  auVar36._1_12_ = SUB1512(auVar41 << 0x20,3);
  auVar36[0] = auVar62[1];
  auVar46._0_2_ = CONCAT11(0,auVar62[0]);
  auVar46._2_13_ = auVar36;
  auVar46[0xf] = 0;
  auVar66._0_2_ = CONCAT11(0,auVar62[8]);
  bVar72 = auVar62[9];
  auVar66[2] = bVar72;
  auVar66[3] = 0;
  bVar73 = auVar62[10];
  auVar66[4] = bVar73;
  auVar66[5] = 0;
  bVar75 = auVar62[0xb];
  auVar66[6] = bVar75;
  auVar66[7] = 0;
  bVar76 = auVar62[0xc];
  auVar66[8] = bVar76;
  auVar66[9] = 0;
  bVar78 = auVar62[0xd];
  auVar66[10] = bVar78;
  auVar66[0xb] = 0;
  bVar79 = auVar62[0xe];
  auVar66[0xc] = bVar79;
  auVar66[0xd] = 0;
  bVar81 = auVar62[0xf];
  auVar66[0xe] = bVar81;
  auVar66[0xf] = 0;
  auVar18[0xd] = 0;
  auVar18._0_13_ = auVar47._0_13_;
  auVar18[0xe] = auVar47[7];
  auVar20[0xc] = auVar47[6];
  auVar20._0_12_ = auVar47._0_12_;
  auVar20._13_2_ = auVar18._13_2_;
  auVar23[0xb] = 0;
  auVar23._0_11_ = auVar47._0_11_;
  auVar23._12_3_ = auVar20._12_3_;
  auVar25[10] = auVar47[5];
  auVar25._0_10_ = auVar47._0_10_;
  auVar25._11_4_ = auVar23._11_4_;
  auVar27[9] = 0;
  auVar27._0_9_ = auVar47._0_9_;
  auVar27._10_5_ = auVar25._10_5_;
  auVar29[8] = auVar47[4];
  auVar29._0_8_ = auVar47._0_8_;
  auVar29._9_6_ = auVar27._9_6_;
  auVar37._7_8_ = 0;
  auVar37._0_7_ = auVar29._8_7_;
  Var38 = CONCAT81(SUB158(auVar37 << 0x40,7),auVar47[3]);
  auVar42._9_6_ = 0;
  auVar42._0_9_ = Var38;
  auVar39._1_10_ = SUB1510(auVar42 << 0x30,5);
  auVar39[0] = auVar47[2];
  auVar43._11_4_ = 0;
  auVar43._0_11_ = auVar39;
  auVar32[2] = auVar47[1];
  auVar32._0_2_ = auVar47._0_2_;
  auVar32._3_12_ = SUB1512(auVar43 << 0x20,3);
  auVar60._0_2_ = auVar47._0_2_ & 0xff;
  auVar60._2_13_ = auVar32._2_13_;
  auVar60[0xf] = 0;
  auVar52._0_2_ = CONCAT11(0,auVar47[8]);
  bVar53 = auVar47[9];
  auVar52[2] = bVar53;
  auVar52[3] = 0;
  bVar54 = auVar47[10];
  auVar52[4] = bVar54;
  auVar52[5] = 0;
  bVar55 = auVar47[0xb];
  auVar52[6] = bVar55;
  auVar52[7] = 0;
  bVar56 = auVar47[0xc];
  auVar52[8] = bVar56;
  auVar52[9] = 0;
  bVar57 = auVar47[0xd];
  auVar52[10] = bVar57;
  auVar52[0xb] = 0;
  bVar58 = auVar47[0xe];
  auVar52[0xc] = bVar58;
  auVar52[0xd] = 0;
  bVar59 = auVar47[0xf];
  auVar52[0xe] = bVar59;
  auVar52[0xf] = 0;
  auVar62 = pshuflw(ZEXT116(above[-1]),ZEXT116(above[-1]),0);
  auVar63._0_4_ = auVar62._0_4_;
  auVar63._4_4_ = auVar63._0_4_;
  auVar63._8_4_ = auVar63._0_4_;
  auVar63._12_4_ = auVar63._0_4_;
  uVar1 = *(ulong *)left;
  sVar61 = auVar62._0_2_;
  auVar47._0_2_ = auVar46._0_2_ - sVar61;
  sVar64 = auVar62._2_2_;
  auVar47._2_2_ = auVar36._0_2_ - sVar64;
  auVar47._4_2_ = auVar35._0_2_ - sVar61;
  sVar50 = (short)Var34;
  auVar47._6_2_ = sVar50 - sVar64;
  auVar47._8_2_ = auVar30._8_2_ - sVar61;
  auVar47._10_2_ = auVar26._10_2_ - sVar64;
  auVar47._12_2_ = auVar22._12_2_ - sVar61;
  auVar47._14_2_ = (uVar21 >> 8) - sVar64;
  auVar84 = pabsw(in_XMM7,auVar47);
  auVar48._0_2_ = auVar60._0_2_ - sVar61;
  auVar48._2_2_ = auVar32._2_2_ - sVar64;
  auVar48._4_2_ = auVar39._0_2_ - sVar61;
  sVar51 = (short)Var38;
  auVar48._6_2_ = sVar51 - sVar64;
  auVar48._8_2_ = auVar29._8_2_ - sVar61;
  auVar48._10_2_ = auVar25._10_2_ - sVar64;
  uVar31 = auVar18._13_2_ >> 8;
  auVar48._12_2_ = auVar20._12_2_ - sVar61;
  auVar48._14_2_ = uVar31 - sVar64;
  auVar96 = pabsw(in_XMM12,auVar48);
  puVar45 = dst + 0x10;
  iVar44 = 8;
  auVar62._0_2_ = auVar66._0_2_ - sVar61;
  auVar62._2_2_ = (ushort)bVar72 - sVar64;
  auVar62._4_2_ = (ushort)bVar73 - sVar61;
  auVar62._6_2_ = (ushort)bVar75 - sVar64;
  auVar62._8_2_ = (ushort)bVar76 - sVar61;
  auVar62._10_2_ = (ushort)bVar78 - sVar64;
  auVar62._12_2_ = (ushort)bVar79 - sVar61;
  auVar62._14_2_ = (ushort)bVar81 - sVar64;
  auVar49 = pabsw(auVar48,auVar62);
  auVar62 = _DAT_004d47a0;
  do {
    auVar67._8_8_ = 0;
    auVar67._0_8_ = uVar1;
    auVar67 = pshufb(auVar67,auVar62);
    sVar65 = auVar67._0_2_;
    sVar68 = auVar67._2_2_;
    sVar69 = auVar67._4_2_;
    sVar70 = auVar67._6_2_;
    sVar71 = auVar67._8_2_;
    sVar74 = auVar67._10_2_;
    sVar77 = auVar67._12_2_;
    sVar80 = auVar67._14_2_;
    auVar102._0_2_ = (auVar47._0_2_ + sVar65) - auVar46._0_2_;
    auVar102._2_2_ = (auVar47._2_2_ + sVar68) - auVar36._0_2_;
    auVar102._4_2_ = (auVar47._4_2_ + sVar69) - auVar35._0_2_;
    auVar102._6_2_ = (auVar47._6_2_ + sVar70) - sVar50;
    auVar102._8_2_ = (auVar47._8_2_ + sVar71) - auVar30._8_2_;
    auVar102._10_2_ = (auVar47._10_2_ + sVar74) - auVar26._10_2_;
    auVar102._12_2_ = (auVar47._12_2_ + sVar77) - auVar22._12_2_;
    auVar102._14_2_ = (auVar47._14_2_ + sVar80) - (uVar21 >> 8);
    auVar89 = pabsw(auVar102,auVar102);
    auVar82._0_2_ = (auVar47._0_2_ + sVar65) - sVar61;
    auVar82._2_2_ = (auVar47._2_2_ + sVar68) - sVar64;
    auVar82._4_2_ = (auVar47._4_2_ + sVar69) - sVar61;
    auVar82._6_2_ = (auVar47._6_2_ + sVar70) - sVar64;
    auVar82._8_2_ = (auVar47._8_2_ + sVar71) - sVar61;
    auVar82._10_2_ = (auVar47._10_2_ + sVar74) - sVar64;
    auVar82._12_2_ = (auVar47._12_2_ + sVar77) - sVar61;
    auVar82._14_2_ = (auVar47._14_2_ + sVar80) - sVar64;
    auVar82 = pabsw(auVar82,auVar82);
    auVar97._0_2_ = -(ushort)(auVar89._0_2_ < auVar84._0_2_);
    auVar97._2_2_ = -(ushort)(auVar89._2_2_ < auVar84._2_2_);
    auVar97._4_2_ = -(ushort)(auVar89._4_2_ < auVar84._4_2_);
    auVar97._6_2_ = -(ushort)(auVar89._6_2_ < auVar84._6_2_);
    auVar97._8_2_ = -(ushort)(auVar89._8_2_ < auVar84._8_2_);
    auVar97._10_2_ = -(ushort)(auVar89._10_2_ < auVar84._10_2_);
    auVar97._12_2_ = -(ushort)(auVar89._12_2_ < auVar84._12_2_);
    auVar97._14_2_ = -(ushort)(auVar89._14_2_ < auVar84._14_2_);
    auVar101._0_2_ = -(ushort)(auVar82._0_2_ < auVar84._0_2_);
    auVar101._2_2_ = -(ushort)(auVar82._2_2_ < auVar84._2_2_);
    auVar101._4_2_ = -(ushort)(auVar82._4_2_ < auVar84._4_2_);
    auVar101._6_2_ = -(ushort)(auVar82._6_2_ < auVar84._6_2_);
    auVar101._8_2_ = -(ushort)(auVar82._8_2_ < auVar84._8_2_);
    auVar101._10_2_ = -(ushort)(auVar82._10_2_ < auVar84._10_2_);
    auVar101._12_2_ = -(ushort)(auVar82._12_2_ < auVar84._12_2_);
    auVar101._14_2_ = -(ushort)(auVar82._14_2_ < auVar84._14_2_);
    auVar90._0_2_ = -(ushort)(auVar82._0_2_ < auVar89._0_2_);
    auVar90._2_2_ = -(ushort)(auVar82._2_2_ < auVar89._2_2_);
    auVar90._4_2_ = -(ushort)(auVar82._4_2_ < auVar89._4_2_);
    auVar90._6_2_ = -(ushort)(auVar82._6_2_ < auVar89._6_2_);
    auVar90._8_2_ = -(ushort)(auVar82._8_2_ < auVar89._8_2_);
    auVar90._10_2_ = -(ushort)(auVar82._10_2_ < auVar89._10_2_);
    auVar90._12_2_ = -(ushort)(auVar82._12_2_ < auVar89._12_2_);
    auVar90._14_2_ = -(ushort)(auVar82._14_2_ < auVar89._14_2_);
    auVar98._0_2_ = sVar65 - sVar61;
    auVar98._2_2_ = sVar68 - sVar64;
    auVar98._4_2_ = sVar69 - sVar61;
    auVar98._6_2_ = sVar70 - sVar64;
    auVar98._8_2_ = sVar71 - sVar61;
    auVar98._10_2_ = sVar74 - sVar64;
    auVar98._12_2_ = sVar77 - sVar61;
    auVar98._14_2_ = sVar80 - sVar64;
    auVar104 = pabsw(in_XMM15,auVar98);
    auVar89._0_2_ = (auVar98._0_2_ + auVar66._0_2_) - sVar61;
    auVar89._2_2_ = (auVar98._2_2_ + (ushort)bVar72) - sVar64;
    auVar89._4_2_ = (auVar98._4_2_ + (ushort)bVar73) - sVar61;
    auVar89._6_2_ = (auVar98._6_2_ + (ushort)bVar75) - sVar64;
    auVar89._8_2_ = (auVar98._8_2_ + (ushort)bVar76) - sVar61;
    auVar89._10_2_ = (auVar98._10_2_ + (ushort)bVar78) - sVar64;
    auVar89._12_2_ = (auVar98._12_2_ + (ushort)bVar79) - sVar61;
    auVar89._14_2_ = (auVar98._14_2_ + (ushort)bVar81) - sVar64;
    auVar82 = pabsw(auVar89,auVar89);
    sVar103 = auVar104._0_2_;
    auVar93._0_2_ = -(ushort)(sVar103 < auVar49._0_2_);
    sVar106 = auVar104._2_2_;
    auVar93._2_2_ = -(ushort)(sVar106 < auVar49._2_2_);
    sVar107 = auVar104._4_2_;
    auVar93._4_2_ = -(ushort)(sVar107 < auVar49._4_2_);
    sVar108 = auVar104._6_2_;
    auVar93._6_2_ = -(ushort)(sVar108 < auVar49._6_2_);
    sVar109 = auVar104._8_2_;
    auVar93._8_2_ = -(ushort)(sVar109 < auVar49._8_2_);
    sVar110 = auVar104._10_2_;
    auVar93._10_2_ = -(ushort)(sVar110 < auVar49._10_2_);
    sVar111 = auVar104._12_2_;
    auVar93._12_2_ = -(ushort)(sVar111 < auVar49._12_2_);
    sVar112 = auVar104._14_2_;
    auVar93._14_2_ = -(ushort)(sVar112 < auVar49._14_2_);
    auVar85._0_2_ = -(ushort)(auVar82._0_2_ < auVar49._0_2_);
    auVar85._2_2_ = -(ushort)(auVar82._2_2_ < auVar49._2_2_);
    auVar85._4_2_ = -(ushort)(auVar82._4_2_ < auVar49._4_2_);
    auVar85._6_2_ = -(ushort)(auVar82._6_2_ < auVar49._6_2_);
    auVar85._8_2_ = -(ushort)(auVar82._8_2_ < auVar49._8_2_);
    auVar85._10_2_ = -(ushort)(auVar82._10_2_ < auVar49._10_2_);
    auVar85._12_2_ = -(ushort)(auVar82._12_2_ < auVar49._12_2_);
    auVar85._14_2_ = -(ushort)(auVar82._14_2_ < auVar49._14_2_);
    auVar94._0_2_ = -(ushort)(auVar82._0_2_ < sVar103);
    auVar94._2_2_ = -(ushort)(auVar82._2_2_ < sVar106);
    auVar94._4_2_ = -(ushort)(auVar82._4_2_ < sVar107);
    auVar94._6_2_ = -(ushort)(auVar82._6_2_ < sVar108);
    auVar94._8_2_ = -(ushort)(auVar82._8_2_ < sVar109);
    auVar94._10_2_ = -(ushort)(auVar82._10_2_ < sVar110);
    auVar94._12_2_ = -(ushort)(auVar82._12_2_ < sVar111);
    auVar94._14_2_ = -(ushort)(auVar82._14_2_ < sVar112);
    auVar102 = ~(auVar101 | auVar97) & auVar67 |
               (~auVar90 & auVar46 | auVar63 & auVar90) & (auVar101 | auVar97);
    auVar89 = ~(auVar85 | auVar93) & auVar67 |
              (~auVar94 & auVar66 | auVar63 & auVar94) & (auVar85 | auVar93);
    sVar2 = auVar102._0_2_;
    sVar3 = auVar102._2_2_;
    sVar4 = auVar102._4_2_;
    sVar5 = auVar102._6_2_;
    sVar6 = auVar102._8_2_;
    sVar7 = auVar102._10_2_;
    sVar8 = auVar102._12_2_;
    sVar9 = auVar102._14_2_;
    sVar10 = auVar89._0_2_;
    sVar11 = auVar89._2_2_;
    sVar12 = auVar89._4_2_;
    sVar13 = auVar89._6_2_;
    sVar14 = auVar89._8_2_;
    sVar15 = auVar89._10_2_;
    sVar16 = auVar89._12_2_;
    sVar17 = auVar89._14_2_;
    auVar104._0_2_ = (auVar48._0_2_ + sVar65) - auVar60._0_2_;
    auVar104._2_2_ = (auVar48._2_2_ + sVar68) - auVar32._2_2_;
    auVar104._4_2_ = (auVar48._4_2_ + sVar69) - auVar39._0_2_;
    auVar104._6_2_ = (auVar48._6_2_ + sVar70) - sVar51;
    auVar104._8_2_ = (auVar48._8_2_ + sVar71) - auVar29._8_2_;
    auVar104._10_2_ = (auVar48._10_2_ + sVar74) - auVar25._10_2_;
    auVar104._12_2_ = (auVar48._12_2_ + sVar77) - auVar20._12_2_;
    auVar104._14_2_ = (auVar48._14_2_ + sVar80) - uVar31;
    auVar82 = pabsw(auVar104,auVar104);
    auVar86._0_2_ = (auVar48._0_2_ + sVar65) - sVar61;
    auVar86._2_2_ = (auVar48._2_2_ + sVar68) - sVar64;
    auVar86._4_2_ = (auVar48._4_2_ + sVar69) - sVar61;
    auVar86._6_2_ = (auVar48._6_2_ + sVar70) - sVar64;
    auVar86._8_2_ = (auVar48._8_2_ + sVar71) - sVar61;
    auVar86._10_2_ = (auVar48._10_2_ + sVar74) - sVar64;
    auVar86._12_2_ = (auVar48._12_2_ + sVar77) - sVar61;
    auVar86._14_2_ = (auVar48._14_2_ + sVar80) - sVar64;
    auVar104 = pabsw(auVar86,auVar86);
    auVar95._0_2_ = -(ushort)(auVar82._0_2_ < auVar96._0_2_);
    auVar95._2_2_ = -(ushort)(auVar82._2_2_ < auVar96._2_2_);
    auVar95._4_2_ = -(ushort)(auVar82._4_2_ < auVar96._4_2_);
    auVar95._6_2_ = -(ushort)(auVar82._6_2_ < auVar96._6_2_);
    auVar95._8_2_ = -(ushort)(auVar82._8_2_ < auVar96._8_2_);
    auVar95._10_2_ = -(ushort)(auVar82._10_2_ < auVar96._10_2_);
    auVar95._12_2_ = -(ushort)(auVar82._12_2_ < auVar96._12_2_);
    auVar95._14_2_ = -(ushort)(auVar82._14_2_ < auVar96._14_2_);
    auVar91._0_2_ = -(ushort)(auVar104._0_2_ < auVar96._0_2_);
    auVar91._2_2_ = -(ushort)(auVar104._2_2_ < auVar96._2_2_);
    auVar91._4_2_ = -(ushort)(auVar104._4_2_ < auVar96._4_2_);
    auVar91._6_2_ = -(ushort)(auVar104._6_2_ < auVar96._6_2_);
    auVar91._8_2_ = -(ushort)(auVar104._8_2_ < auVar96._8_2_);
    auVar91._10_2_ = -(ushort)(auVar104._10_2_ < auVar96._10_2_);
    auVar91._12_2_ = -(ushort)(auVar104._12_2_ < auVar96._12_2_);
    auVar91._14_2_ = -(ushort)(auVar104._14_2_ < auVar96._14_2_);
    auVar83._0_2_ = -(ushort)(auVar104._0_2_ < auVar82._0_2_);
    auVar83._2_2_ = -(ushort)(auVar104._2_2_ < auVar82._2_2_);
    auVar83._4_2_ = -(ushort)(auVar104._4_2_ < auVar82._4_2_);
    auVar83._6_2_ = -(ushort)(auVar104._6_2_ < auVar82._6_2_);
    auVar83._8_2_ = -(ushort)(auVar104._8_2_ < auVar82._8_2_);
    auVar83._10_2_ = -(ushort)(auVar104._10_2_ < auVar82._10_2_);
    auVar83._12_2_ = -(ushort)(auVar104._12_2_ < auVar82._12_2_);
    auVar83._14_2_ = -(ushort)(auVar104._14_2_ < auVar82._14_2_);
    auVar87._0_2_ = auVar52._0_2_ - sVar61;
    auVar87._2_2_ = (ushort)bVar53 - sVar64;
    auVar87._4_2_ = (ushort)bVar54 - sVar61;
    auVar87._6_2_ = (ushort)bVar55 - sVar64;
    auVar87._8_2_ = (ushort)bVar56 - sVar61;
    auVar87._10_2_ = (ushort)bVar57 - sVar64;
    auVar87._12_2_ = (ushort)bVar58 - sVar61;
    auVar87._14_2_ = (ushort)bVar59 - sVar64;
    auVar82 = pabsw(auVar87,auVar87);
    auVar99._0_2_ = (auVar98._0_2_ + auVar52._0_2_) - sVar61;
    auVar99._2_2_ = (auVar98._2_2_ + (ushort)bVar53) - sVar64;
    auVar99._4_2_ = (auVar98._4_2_ + (ushort)bVar54) - sVar61;
    auVar99._6_2_ = (auVar98._6_2_ + (ushort)bVar55) - sVar64;
    auVar99._8_2_ = (auVar98._8_2_ + (ushort)bVar56) - sVar61;
    auVar99._10_2_ = (auVar98._10_2_ + (ushort)bVar57) - sVar64;
    auVar99._12_2_ = (auVar98._12_2_ + (ushort)bVar58) - sVar61;
    auVar99._14_2_ = (auVar98._14_2_ + (ushort)bVar59) - sVar64;
    auVar104 = pabsw(auVar95,auVar99);
    auVar100._0_2_ = -(ushort)(sVar103 < auVar82._0_2_);
    auVar100._2_2_ = -(ushort)(sVar106 < auVar82._2_2_);
    auVar100._4_2_ = -(ushort)(sVar107 < auVar82._4_2_);
    auVar100._6_2_ = -(ushort)(sVar108 < auVar82._6_2_);
    auVar100._8_2_ = -(ushort)(sVar109 < auVar82._8_2_);
    auVar100._10_2_ = -(ushort)(sVar110 < auVar82._10_2_);
    auVar100._12_2_ = -(ushort)(sVar111 < auVar82._12_2_);
    auVar100._14_2_ = -(ushort)(sVar112 < auVar82._14_2_);
    auVar88._0_2_ = -(ushort)(auVar104._0_2_ < auVar82._0_2_);
    auVar88._2_2_ = -(ushort)(auVar104._2_2_ < auVar82._2_2_);
    auVar88._4_2_ = -(ushort)(auVar104._4_2_ < auVar82._4_2_);
    auVar88._6_2_ = -(ushort)(auVar104._6_2_ < auVar82._6_2_);
    auVar88._8_2_ = -(ushort)(auVar104._8_2_ < auVar82._8_2_);
    auVar88._10_2_ = -(ushort)(auVar104._10_2_ < auVar82._10_2_);
    auVar88._12_2_ = -(ushort)(auVar104._12_2_ < auVar82._12_2_);
    auVar88._14_2_ = -(ushort)(auVar104._14_2_ < auVar82._14_2_);
    auVar105._0_2_ = -(ushort)(auVar104._0_2_ < sVar103);
    auVar105._2_2_ = -(ushort)(auVar104._2_2_ < sVar106);
    auVar105._4_2_ = -(ushort)(auVar104._4_2_ < sVar107);
    auVar105._6_2_ = -(ushort)(auVar104._6_2_ < sVar108);
    auVar105._8_2_ = -(ushort)(auVar104._8_2_ < sVar109);
    auVar105._10_2_ = -(ushort)(auVar104._10_2_ < sVar110);
    auVar105._12_2_ = -(ushort)(auVar104._12_2_ < sVar111);
    auVar105._14_2_ = -(ushort)(auVar104._14_2_ < sVar112);
    auVar82 = ~(auVar91 | auVar95) & auVar67 |
              (~auVar83 & auVar60 | auVar63 & auVar83) & (auVar91 | auVar95);
    in_XMM15 = (~auVar105 & auVar52 | auVar63 & auVar105) & (auVar88 | auVar100);
    auVar67 = ~(auVar88 | auVar100) & auVar67 | in_XMM15;
    sVar65 = auVar82._0_2_;
    sVar68 = auVar82._2_2_;
    sVar69 = auVar82._4_2_;
    sVar70 = auVar82._6_2_;
    sVar71 = auVar82._8_2_;
    sVar74 = auVar82._10_2_;
    sVar77 = auVar82._12_2_;
    sVar80 = auVar82._14_2_;
    sVar103 = auVar67._0_2_;
    sVar106 = auVar67._2_2_;
    sVar107 = auVar67._4_2_;
    sVar108 = auVar67._6_2_;
    sVar109 = auVar67._8_2_;
    sVar110 = auVar67._10_2_;
    sVar111 = auVar67._12_2_;
    sVar112 = auVar67._14_2_;
    puVar45[-0x10] = (0 < sVar2) * (sVar2 < 0x100) * auVar102[0] - (0xff < sVar2);
    puVar45[-0xf] = (0 < sVar3) * (sVar3 < 0x100) * auVar102[2] - (0xff < sVar3);
    puVar45[-0xe] = (0 < sVar4) * (sVar4 < 0x100) * auVar102[4] - (0xff < sVar4);
    puVar45[-0xd] = (0 < sVar5) * (sVar5 < 0x100) * auVar102[6] - (0xff < sVar5);
    puVar45[-0xc] = (0 < sVar6) * (sVar6 < 0x100) * auVar102[8] - (0xff < sVar6);
    puVar45[-0xb] = (0 < sVar7) * (sVar7 < 0x100) * auVar102[10] - (0xff < sVar7);
    puVar45[-10] = (0 < sVar8) * (sVar8 < 0x100) * auVar102[0xc] - (0xff < sVar8);
    puVar45[-9] = (0 < sVar9) * (sVar9 < 0x100) * auVar102[0xe] - (0xff < sVar9);
    puVar45[-8] = (0 < sVar10) * (sVar10 < 0x100) * auVar89[0] - (0xff < sVar10);
    puVar45[-7] = (0 < sVar11) * (sVar11 < 0x100) * auVar89[2] - (0xff < sVar11);
    puVar45[-6] = (0 < sVar12) * (sVar12 < 0x100) * auVar89[4] - (0xff < sVar12);
    puVar45[-5] = (0 < sVar13) * (sVar13 < 0x100) * auVar89[6] - (0xff < sVar13);
    puVar45[-4] = (0 < sVar14) * (sVar14 < 0x100) * auVar89[8] - (0xff < sVar14);
    puVar45[-3] = (0 < sVar15) * (sVar15 < 0x100) * auVar89[10] - (0xff < sVar15);
    puVar45[-2] = (0 < sVar16) * (sVar16 < 0x100) * auVar89[0xc] - (0xff < sVar16);
    puVar45[-1] = (0 < sVar17) * (sVar17 < 0x100) * auVar89[0xe] - (0xff < sVar17);
    *puVar45 = (0 < sVar65) * (sVar65 < 0x100) * auVar82[0] - (0xff < sVar65);
    puVar45[1] = (0 < sVar68) * (sVar68 < 0x100) * auVar82[2] - (0xff < sVar68);
    puVar45[2] = (0 < sVar69) * (sVar69 < 0x100) * auVar82[4] - (0xff < sVar69);
    puVar45[3] = (0 < sVar70) * (sVar70 < 0x100) * auVar82[6] - (0xff < sVar70);
    puVar45[4] = (0 < sVar71) * (sVar71 < 0x100) * auVar82[8] - (0xff < sVar71);
    puVar45[5] = (0 < sVar74) * (sVar74 < 0x100) * auVar82[10] - (0xff < sVar74);
    puVar45[6] = (0 < sVar77) * (sVar77 < 0x100) * auVar82[0xc] - (0xff < sVar77);
    puVar45[7] = (0 < sVar80) * (sVar80 < 0x100) * auVar82[0xe] - (0xff < sVar80);
    puVar45[8] = (0 < sVar103) * (sVar103 < 0x100) * auVar67[0] - (0xff < sVar103);
    puVar45[9] = (0 < sVar106) * (sVar106 < 0x100) * auVar67[2] - (0xff < sVar106);
    puVar45[10] = (0 < sVar107) * (sVar107 < 0x100) * auVar67[4] - (0xff < sVar107);
    puVar45[0xb] = (0 < sVar108) * (sVar108 < 0x100) * auVar67[6] - (0xff < sVar108);
    puVar45[0xc] = (0 < sVar109) * (sVar109 < 0x100) * auVar67[8] - (0xff < sVar109);
    puVar45[0xd] = (0 < sVar110) * (sVar110 < 0x100) * auVar67[10] - (0xff < sVar110);
    puVar45[0xe] = (0 < sVar111) * (sVar111 < 0x100) * auVar67[0xc] - (0xff < sVar111);
    puVar45[0xf] = (0 < sVar112) * (sVar112 < 0x100) * auVar67[0xe] - (0xff < sVar112);
    auVar92._0_2_ = auVar62._0_2_ + 1;
    auVar92._2_2_ = auVar62._2_2_ + 1;
    auVar92._4_2_ = auVar62._4_2_ + 1;
    auVar92._6_2_ = auVar62._6_2_ + 1;
    auVar92._8_2_ = auVar62._8_2_ + 1;
    auVar92._10_2_ = auVar62._10_2_ + 1;
    auVar92._12_2_ = auVar62._12_2_ + 1;
    auVar92._14_2_ = auVar62._14_2_ + 1;
    puVar45 = puVar45 + stride;
    iVar44 = iVar44 + -1;
    auVar62 = auVar92;
  } while (iVar44 != 0);
  return;
}

Assistant:

void aom_paeth_predictor_32x8_ssse3(uint8_t *dst, ptrdiff_t stride,
                                    const uint8_t *above, const uint8_t *left) {
  const __m128i a = _mm_load_si128((const __m128i *)above);
  const __m128i b = _mm_load_si128((const __m128i *)(above + 16));
  const __m128i zero = _mm_setzero_si128();
  const __m128i al = _mm_unpacklo_epi8(a, zero);
  const __m128i ah = _mm_unpackhi_epi8(a, zero);
  const __m128i bl = _mm_unpacklo_epi8(b, zero);
  const __m128i bh = _mm_unpackhi_epi8(b, zero);

  const __m128i tl16 = _mm_set1_epi16((int16_t)above[-1]);
  __m128i rep = _mm_set1_epi16((short)0x8000);
  const __m128i one = _mm_set1_epi16(1);
  const __m128i l = _mm_loadl_epi64((const __m128i *)left);
  __m128i l16;

  for (int i = 0; i < 8; ++i) {
    l16 = _mm_shuffle_epi8(l, rep);
    const __m128i r32l = paeth_16x1_pred(&l16, &al, &ah, &tl16);
    const __m128i r32h = paeth_16x1_pred(&l16, &bl, &bh, &tl16);

    _mm_store_si128((__m128i *)dst, r32l);
    _mm_store_si128((__m128i *)(dst + 16), r32h);
    dst += stride;
    rep = _mm_add_epi16(rep, one);
  }
}